

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::GenTypeBasic_abi_cxx11_
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,BaseType *type)

{
  char *__s;
  allocator<char> local_9;
  
  switch(*type) {
  case BASE_TYPE_NONE:
  case BASE_TYPE_UTYPE:
  case BASE_TYPE_UCHAR:
    __s = "UByte";
    break;
  case BASE_TYPE_BOOL:
    __s = "Boolean";
    break;
  case BASE_TYPE_CHAR:
    __s = "Byte";
    break;
  case BASE_TYPE_SHORT:
    __s = "Short";
    break;
  case BASE_TYPE_USHORT:
    __s = "UShort";
    break;
  default:
    __s = "Int";
    break;
  case BASE_TYPE_UINT:
    __s = "UInt";
    break;
  case BASE_TYPE_LONG:
    __s = "Long";
    break;
  case BASE_TYPE_ULONG:
    __s = "ULong";
    break;
  case BASE_TYPE_FLOAT:
    __s = "Float";
    break;
  case BASE_TYPE_DOUBLE:
    __s = "Double";
    break;
  case BASE_TYPE_STRING:
  case BASE_TYPE_STRUCT:
    __s = "Offset";
    break;
  case BASE_TYPE_VECTOR:
  case BASE_TYPE_ARRAY:
    __s = "VectorOffset";
    break;
  case BASE_TYPE_UNION:
    __s = "UnionOffset";
    break;
  case BASE_TYPE_VECTOR64:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_kotlin_kmp.cpp"
                  ,0xe2,
                  "std::string flatbuffers::kotlin::KotlinKMPGenerator::GenTypeBasic(const BaseType &) const"
                 );
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeBasic(const BaseType &type) const {
    switch (type) {
      case BASE_TYPE_NONE:
      case BASE_TYPE_UTYPE: return "UByte";
      case BASE_TYPE_BOOL: return "Boolean";
      case BASE_TYPE_CHAR: return "Byte";
      case BASE_TYPE_UCHAR: return "UByte";
      case BASE_TYPE_SHORT: return "Short";
      case BASE_TYPE_USHORT: return "UShort";
      case BASE_TYPE_INT: return "Int";
      case BASE_TYPE_UINT: return "UInt";
      case BASE_TYPE_LONG: return "Long";
      case BASE_TYPE_ULONG: return "ULong";
      case BASE_TYPE_FLOAT: return "Float";
      case BASE_TYPE_DOUBLE: return "Double";
      case BASE_TYPE_STRING:
      case BASE_TYPE_STRUCT: return "Offset";
      case BASE_TYPE_UNION: return "UnionOffset";
      case BASE_TYPE_VECTOR:
      case BASE_TYPE_ARRAY: return "VectorOffset";
      // VECTOR64 not supported
      case BASE_TYPE_VECTOR64: FLATBUFFERS_ASSERT(0);
    }
    return "Int";
  }